

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int codepoint(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  int local_4c;
  ulong uStack_48;
  int code;
  char *se;
  lua_Integer lStack_38;
  int n;
  lua_Integer pose;
  lua_Integer posi;
  char *s;
  size_t len;
  lua_State *L_local;
  
  len = (size_t)L;
  posi = (lua_Integer)luaL_checklstring(L,1,(size_t *)&s);
  lVar2 = luaL_optinteger((lua_State *)len,2,1);
  pose = u_posrelat(lVar2,(size_t)s);
  lVar2 = luaL_optinteger((lua_State *)len,3,pose);
  lStack_38 = u_posrelat(lVar2,(size_t)s);
  if (pose < 1) {
    luaL_argerror((lua_State *)len,2,"out of range");
  }
  if ((long)s < lStack_38) {
    luaL_argerror((lua_State *)len,3,"out of range");
  }
  if (lStack_38 < pose) {
    L_local._4_4_ = 0;
  }
  else if (lStack_38 - pose < 0x7fffffff) {
    se._4_4_ = ((int)lStack_38 - (int)pose) + 1;
    luaL_checkstack((lua_State *)len,se._4_4_,"string slice too long");
    se._4_4_ = 0;
    uStack_48 = posi + lStack_38;
    posi = pose + -1 + posi;
    while ((ulong)posi < uStack_48) {
      posi = (lua_Integer)utf8_decode((char *)posi,&local_4c);
      if ((char *)posi == (char *)0x0) {
        iVar1 = luaL_error((lua_State *)len,"invalid UTF-8 code");
        return iVar1;
      }
      lua_pushinteger((lua_State *)len,(long)local_4c);
      se._4_4_ = se._4_4_ + 1;
    }
    L_local._4_4_ = se._4_4_;
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)len,"string slice too long");
  }
  return L_local._4_4_;
}

Assistant:

static int codepoint (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
  lua_Integer pose = u_posrelat(luaL_optinteger(L, 3, posi), len);
  int n;
  const char *se;
  luaL_argcheck(L, posi >= 1, 2, "out of range");
  luaL_argcheck(L, pose <= (lua_Integer)len, 3, "out of range");
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (pose - posi >= INT_MAX)  /* (lua_Integer -> int) overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;
  luaL_checkstack(L, n, "string slice too long");
  n = 0;
  se = s + pose;
  for (s += posi - 1; s < se;) {
    int code;
    s = utf8_decode(s, &code);
    if (s == NULL)
      return luaL_error(L, "invalid UTF-8 code");
    lua_pushinteger(L, code);
    n++;
  }
  return n;
}